

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<false,_false,_false>::pack_tail(DaTrie<false,_false,_false> *this)

{
  pointer pcVar1;
  pointer pBVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  uint32_t uVar6;
  char *str;
  uint32_t node_pos;
  ulong uVar7;
  Query query;
  _Vector_base<char,_std::allocator<char>_> local_58;
  Query local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)&local_58,
             (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + this->tail_emps_));
  pcVar1 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58._M_impl.super__Vector_impl_data._M_start;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_impl.super__Vector_impl_data._M_start = pcVar3;
  local_58._M_impl.super__Vector_impl_data._M_finish = pcVar4;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar1;
  for (uVar7 = 0;
      pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 3 &
              0xffffffff); uVar7 = uVar7 + 1) {
    if ((pBVar2[uVar7].field_0x3 & 0x80) != 0) {
      bVar5 = is_terminal_(this,(uint32_t)uVar7);
      if (!bVar5) {
        str = local_58._M_impl.super__Vector_impl_data._M_start +
              (SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7],0) & 0x7fffffff);
        local_40.pos_ = 0;
        local_40.value_ = 0x7fffffff;
        local_40.node_pos_ = 0;
        local_40.is_finished_ = false;
        local_40.key_ = str;
        uVar6 = utils::length(str);
        local_40.value_ = *(uint32_t *)(str + uVar6);
        local_40.node_pos_ = (uint32_t)uVar7;
        insert_tail_(this,&local_40);
      }
    }
  }
  this->tail_emps_ = 0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void pack_tail() {
    assert(!Prefix);

    std::vector<char> tail;
    tail.reserve(tail_.size() - tail_emps_);

    tail_.swap(tail);

    for (uint32_t node_pos = 0; node_pos < bc_size(); ++node_pos) {
      if (bc_[node_pos].is_leaf() && !is_terminal_(node_pos)) {
        auto _tail = tail.data() + bc_[node_pos].value();
        Query query(_tail);
        query.set_value(utils::extract_value(_tail + utils::length(_tail)));
        query.set_node_pos(node_pos);
        insert_tail_(query);
      }
    }
    tail_emps_ = 0;
  }